

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlIsUnreserved(xmlURIPtr uri,char *cur)

{
  char *cur_local;
  xmlURIPtr uri_local;
  
  if (uri == (xmlURIPtr)0x0) {
    uri_local._4_4_ = 0;
  }
  else if ((((*cur < 'a') || ('z' < *cur)) && ((*cur < 'A' || ('Z' < *cur)))) &&
          (((((*cur < '0' || ('9' < *cur)) && (*cur != '-')) && ((*cur != '.' && (*cur != '_')))) &&
           (*cur != '~')))) {
    if ((uri->cleanup & 1U) == 0) {
      if (((uri->cleanup & 4U) != 0) &&
         ((((*cur < '!' || ('~' < *cur)) ||
           ((*cur == '<' || (((*cur == '>' || (*cur == '\"')) || (*cur == '{')))))) ||
          ((((*cur == '}' || (*cur == '|')) || (*cur == '\\')) || ((*cur == '^' || (*cur == '`')))))
          ))) {
        return 1;
      }
    }
    else if (((((*cur == '{') || (*cur == '}')) || (*cur == '|')) ||
             ((*cur == '\\' || (*cur == '^')))) ||
            ((*cur == '[' || ((*cur == ']' || (*cur == '`')))))) {
      return 1;
    }
    uri_local._4_4_ = 0;
  }
  else {
    uri_local._4_4_ = 1;
  }
  return uri_local._4_4_;
}

Assistant:

static int
xmlIsUnreserved(xmlURIPtr uri, const char *cur) {
    if (uri == NULL)
        return(0);

    if (ISA_STRICTLY_UNRESERVED(cur))
        return(1);

    if (uri->cleanup & XML_URI_ALLOW_UNWISE) {
        if (IS_UNWISE(cur))
            return(1);
    } else if (uri->cleanup & XML_URI_ALLOW_UCSCHAR) {
        if (ISA_UCSCHAR(cur))
            return(1);
    }

    return(0);
}